

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioJson.c
# Opt level: O1

Vec_Wec_t * Json_Read(char *pFileName,Abc_Nam_t **ppStrs)

{
  byte bVar1;
  int iVar2;
  uint Entry;
  uint uVar3;
  int iVar4;
  FILE *__stream;
  char *pIn;
  byte *__s;
  size_t sVar5;
  Vec_Wec_t *pVVar6;
  Vec_Int_t *pVVar7;
  int *piVar8;
  Abc_Nam_t *p;
  ulong uVar9;
  byte *pbVar10;
  Vec_Int_t *pVVar11;
  byte *pLim;
  Vec_Int_t *p_00;
  byte *pbVar12;
  byte *pbVar13;
  long lVar14;
  
  __stream = fopen(pFileName,"rb");
  if (__stream == (FILE *)0x0) {
    pVVar6 = (Vec_Wec_t *)0x0;
    printf("Cannot open file \"%s\" for reading.\n",pFileName);
  }
  else {
    iVar4 = Extra_FileSize(pFileName);
    pIn = (char *)malloc((long)(iVar4 + 1));
    fread(pIn,(long)iVar4,1,__stream);
    pIn[iVar4] = '\0';
    fclose(__stream);
    __s = (byte *)Json_ReadPreprocess(pIn,iVar4);
    sVar5 = strlen((char *)__s);
    if (pIn != (char *)0x0) {
      free(pIn);
    }
    pVVar6 = (Vec_Wec_t *)malloc(0x10);
    pVVar6->nCap = 1000;
    pVVar6->nSize = 0;
    pVVar7 = (Vec_Int_t *)calloc(1000,0x10);
    pVVar6->pArray = pVVar7;
    pVVar7 = (Vec_Int_t *)malloc(0x10);
    pVVar7->nCap = 100;
    pVVar7->nSize = 0;
    piVar8 = (int *)malloc(400);
    pVVar7->pArray = piVar8;
    p = Abc_NamStart(1000,0x18);
    if (0 < (long)(int)sVar5) {
      pbVar12 = __s;
LAB_003299ec:
      do {
        bVar1 = *pbVar12;
        uVar9 = (ulong)bVar1;
        pbVar13 = pbVar12;
        if (uVar9 < 0x3b) {
          if ((0x400000100002600U >> (uVar9 & 0x3f) & 1) != 0) {
            pbVar12 = pbVar12 + 1;
            goto LAB_003299ec;
          }
          if (uVar9 == 0) break;
        }
        while ((0x3a < (ulong)*pbVar13 ||
               ((0x400000100002600U >> ((ulong)*pbVar13 & 0x3f) & 1) == 0))) {
          pbVar13 = pbVar13 + 1;
        }
        if (bVar1 < 0x5d) {
          if ((bVar1 == 0x2c) || (bVar1 == 0x3a)) {
LAB_00329b6c:
            pbVar13 = pbVar12 + 1;
          }
          else {
            if (bVar1 == 0x5b) goto LAB_00329ae0;
LAB_00329a47:
            pbVar10 = pbVar13 + -1;
            if (pbVar13[-1] != 0x2c) {
              pbVar10 = pbVar13;
            }
            pLim = pbVar10 + -1;
            if (pbVar10[-1] != 0x22) {
              pLim = pbVar10;
            }
            iVar4 = Abc_NamStrFindOrAddLim
                              (p,(char *)(pbVar12 + (bVar1 == 0x22)),(char *)pLim,(int *)0x0);
            if ((long)pVVar7->nSize < 1) {
              __assert_fail("p->nSize > 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x203,"int Vec_IntEntryLast(Vec_Int_t *)");
            }
            iVar2 = pVVar7->pArray[(long)pVVar7->nSize + -1];
            if (((long)iVar2 < 0) || (pVVar6->nSize <= iVar2)) goto LAB_00329cdd;
            if (iVar4 < 0) goto LAB_00329cfc;
            Vec_IntPush(pVVar6->pArray + iVar2,iVar4 * 2 + 1);
          }
        }
        else {
          if ((bVar1 == 0x5d) || (bVar1 == 0x7d)) {
            if (pVVar7->nSize < 1) {
              __assert_fail("p->nSize > 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x3bc,"int Vec_IntPop(Vec_Int_t *)");
            }
            pVVar7->nSize = pVVar7->nSize + -1;
            goto LAB_00329b6c;
          }
          if (bVar1 != 0x7b) goto LAB_00329a47;
LAB_00329ae0:
          if (0 < (long)pVVar7->nSize) {
            iVar4 = pVVar7->pArray[(long)pVVar7->nSize + -1];
            if (((long)iVar4 < 0) || (iVar2 = pVVar6->nSize, iVar2 <= iVar4)) {
LAB_00329cdd:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                            ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
            }
            if (iVar2 < 0) {
LAB_00329cfc:
              __assert_fail("Var >= 0 && !(c >> 1)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                            ,0x12e,"int Abc_Var2Lit(int, int)");
            }
            Vec_IntPush(pVVar6->pArray + iVar4,iVar2 * 2);
          }
          Entry = pVVar6->nSize;
          Vec_IntPush(pVVar7,Entry);
          uVar3 = pVVar6->nCap;
          if (Entry == uVar3) {
            lVar14 = (long)(int)uVar3;
            if ((int)uVar3 < 0x10) {
              if (pVVar6->pArray == (Vec_Int_t *)0x0) {
                pVVar11 = (Vec_Int_t *)malloc(0x100);
              }
              else {
                pVVar11 = (Vec_Int_t *)realloc(pVVar6->pArray,0x100);
              }
              pVVar6->pArray = pVVar11;
              memset(pVVar11 + lVar14,0,(0x10 - lVar14) * 0x10);
              iVar4 = 0x10;
            }
            else {
              iVar4 = uVar3 * 2;
              if (iVar4 <= (int)uVar3) goto LAB_00329bef;
              if (pVVar6->pArray == (Vec_Int_t *)0x0) {
                pVVar11 = (Vec_Int_t *)malloc((ulong)uVar3 << 5);
              }
              else {
                pVVar11 = (Vec_Int_t *)realloc(pVVar6->pArray,(ulong)uVar3 << 5);
              }
              pVVar6->pArray = pVVar11;
              memset(pVVar11 + lVar14,0,lVar14 * 0x10);
            }
            pVVar6->nCap = iVar4;
          }
LAB_00329bef:
          uVar3 = Entry + 1;
          pVVar6->nSize = uVar3;
          if ((int)Entry < 0) {
            __assert_fail("p->nSize > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                          ,0xa1,"Vec_Int_t *Vec_WecEntryLast(Vec_Wec_t *)");
          }
          pVVar11 = pVVar6->pArray;
          p_00 = pVVar11 + ((ulong)uVar3 - 1);
          if (p_00->nCap < 4) {
            if (pVVar11[(ulong)uVar3 - 1].pArray == (int *)0x0) {
              piVar8 = (int *)malloc(0x10);
            }
            else {
              piVar8 = (int *)realloc(pVVar11[(ulong)uVar3 - 1].pArray,0x10);
            }
            pVVar11[(ulong)uVar3 - 1].pArray = piVar8;
            if (piVar8 == (int *)0x0) {
              __assert_fail("p->pArray",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
            }
            p_00->nCap = 4;
          }
          Vec_IntPush(p_00,(uint)(*pbVar12 == 0x5b));
          pbVar13 = pbVar12 + 1;
        }
        pbVar12 = pbVar13;
      } while (pbVar13 < __s + (int)sVar5);
    }
    if (pVVar7->pArray != (int *)0x0) {
      free(pVVar7->pArray);
      pVVar7->pArray = (int *)0x0;
    }
    free(pVVar7);
    if (__s != (byte *)0x0) {
      free(__s);
    }
    *ppStrs = p;
  }
  return pVVar6;
}

Assistant:

Vec_Wec_t * Json_Read( char * pFileName, Abc_Nam_t ** ppStrs )
{
    Abc_Nam_t * pStrs; 
    Vec_Wec_t * vObjs; 
    Vec_Int_t * vStack, * vTemp;
    char * pContents, * pCur, * pNext, * pCur2, * pNext2;
    int nFileSize, RetValue, iToken;
    FILE * pFile;

    // read the file into the buffer
    pFile = fopen( pFileName, "rb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open file \"%s\" for reading.\n", pFileName );
        return NULL;
    }
    nFileSize = Extra_FileSize( pFileName );
    pContents = pCur = ABC_ALLOC( char, nFileSize+1 );
    RetValue = fread( pContents, nFileSize, 1, pFile );
    pContents[nFileSize] = 0;
    fclose( pFile );

    pContents = Json_ReadPreprocess( pCur = pContents, nFileSize );
    nFileSize = strlen(pContents);
    ABC_FREE( pCur );
    pCur = pContents;

    // start data-structures
    vObjs  = Vec_WecAlloc( 1000 );
    vStack = Vec_IntAlloc( 100 );
    pStrs  = Abc_NamStart( 1000, 24 );
    //Json_AddTypes( pStrs );

    // read lines
    assert( Vec_WecSize(vObjs) == 0 );
    assert( Vec_IntSize(vStack) == 0 );
    while ( pCur < pContents + nFileSize )
    {
        pCur  = Json_SkipSpaces( pCur );
        if ( *pCur == '\0' )
            break;
        pNext = Json_SkipNonSpaces( pCur );
        if ( *pCur == '{' || *pCur == '[' )
        {
            // add fanin to node on the previous level
            if ( Vec_IntSize(vStack) > 0 )
                Vec_IntPush( Vec_WecEntry(vObjs, Vec_IntEntryLast(vStack)), Abc_Var2Lit(Vec_WecSize(vObjs), 0) );            
            // add node to the stack
            Vec_IntPush( vStack, Vec_WecSize(vObjs) );
            vTemp = Vec_WecPushLevel( vObjs );
            Vec_IntGrow( vTemp, 4 );
            // remember it as an array
            Vec_IntPush( vTemp, (int)(*pCur == '[') );
            pCur++;
            continue;
        }
        if ( *pCur == '}' || *pCur == ']' )
        {
            Vec_IntPop( vStack );
            pCur++;
            continue;
        }
        if ( *pCur == ',' || *pCur == ':' )
        {
            pCur++;
            continue;
        }
        iToken = Json_TokenCompare( pCur, pNext, &pCur2, &pNext2 );
        if ( iToken == 0 )
            iToken = Abc_NamStrFindOrAddLim( pStrs, pCur2, pNext2, NULL );
        Vec_IntPush( Vec_WecEntry(vObjs, Vec_IntEntryLast(vStack)), Abc_Var2Lit(iToken, 1) );
        pCur = pNext;
    }
    Vec_IntFree( vStack );
    ABC_FREE( pContents );
    *ppStrs = pStrs;
    return vObjs;
}